

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchDiv.c
# Opt level: O2

int Fxch_DivCreate(Fxch_Man_t *pFxchMan,Fxch_SubCube_t *pSubCube0,Fxch_SubCube_t *pSubCube1)

{
  uint *puVar1;
  uint *puVar2;
  int Var;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Vec_Int_t *pVVar10;
  uint *puVar11;
  uint *puVar12;
  char *__assertion;
  int local_4c;
  uint *local_48;
  
  pFxchMan->vCubeFree->nSize = 0;
  iVar3 = Fxch_ManGetLit(pFxchMan,pSubCube0->iCube,(uint)*(ushort *)&pSubCube0->field_0x8);
  iVar4 = Fxch_ManGetLit(pFxchMan,pSubCube1->iCube,(uint)*(ushort *)&pSubCube1->field_0x8);
  if (*(uint *)&pSubCube0->field_0x8 < 0x10000) {
    if (*(uint *)&pSubCube1->field_0x8 < 0x10000) {
      Vec_IntPush(pFxchMan->vCubeFree,iVar3);
    }
    else {
      iVar5 = Fxch_ManGetLit(pFxchMan,pSubCube1->iCube,*(uint *)&pSubCube1->field_0x8 >> 0x10);
      Vec_IntPush(pFxchMan->vCubeFree,iVar3);
      iVar6 = Abc_LitNot(iVar3);
      if (iVar4 == iVar6) {
        Vec_IntPush(pFxchMan->vCubeFree,iVar5);
        goto LAB_003f770f;
      }
      iVar3 = Abc_LitNot(iVar3);
      if (iVar5 != iVar3) goto LAB_003f770f;
    }
    pVVar10 = pFxchMan->vCubeFree;
    iVar3 = iVar4;
  }
  else {
    uVar9 = *(uint *)&pSubCube1->field_0x8;
    iVar5 = Fxch_ManGetLit(pFxchMan,pSubCube0->iCube,*(uint *)&pSubCube0->field_0x8 >> 0x10);
    if (0xffff < uVar9) {
      iVar7 = Fxch_ManGetLit(pFxchMan,pSubCube1->iCube,(uint)*(ushort *)&pSubCube1->field_0xa);
      iVar6 = iVar4;
      if (iVar3 < iVar4) {
        iVar6 = iVar3;
      }
      pVVar10 = pFxchMan->vCubeFree;
      iVar8 = iVar4;
      if (iVar4 < iVar3) {
        iVar8 = iVar3;
      }
      Var = iVar5;
      if (iVar3 < iVar4) {
        Var = iVar7;
        iVar7 = iVar5;
      }
      iVar3 = Abc_Var2Lit(iVar6,0);
      Vec_IntPush(pVVar10,iVar3);
      pVVar10 = pFxchMan->vCubeFree;
      iVar3 = Abc_Var2Lit(iVar8,1);
      Vec_IntPush(pVVar10,iVar3);
      pVVar10 = pFxchMan->vCubeFree;
      iVar3 = Abc_Var2Lit(iVar7,0);
      Vec_IntPush(pVVar10,iVar3);
      pVVar10 = pFxchMan->vCubeFree;
      iVar3 = Abc_Var2Lit(Var,1);
      Vec_IntPush(pVVar10,iVar3);
      if (pFxchMan->vCubeFree->nSize != 4) {
        __assertion = "Vec_IntSize(vCubeFree) == 4";
        uVar9 = 0x1e;
        goto LAB_003f7845;
      }
      puVar2 = (uint *)pFxchMan->vCubeFree->pArray;
      iVar3 = Abc_LitIsCompl(*puVar2);
      local_48 = puVar2 + 1;
      iVar4 = Abc_LitIsCompl(puVar2[1]);
      if ((iVar3 == iVar4) || (3 < (*puVar2 ^ puVar2[1]))) {
        iVar3 = Abc_LitIsCompl(puVar2[1]);
        puVar11 = puVar2 + 2;
        iVar4 = Abc_LitIsCompl(puVar2[2]);
        if ((iVar3 == iVar4) || (3 < (*local_48 ^ puVar2[2]))) {
          iVar3 = Abc_LitIsCompl(puVar2[2]);
          iVar4 = Abc_LitIsCompl(puVar2[3]);
          if ((iVar3 == iVar4) || (puVar12 = puVar2 + 3, 3 < (*puVar12 ^ *puVar11))) {
            return -1;
          }
          iVar3 = Abc_LitIsCompl(*puVar2);
          iVar4 = Abc_LitIsCompl(puVar2[1]);
          if (iVar3 == iVar4) {
            return -1;
          }
        }
        else {
          iVar3 = Abc_LitIsCompl(*puVar2);
          iVar4 = Abc_LitIsCompl(puVar2[3]);
          if (iVar3 == iVar4) {
            return -1;
          }
          puVar12 = puVar11;
          puVar11 = local_48;
          local_48 = puVar2 + 3;
        }
        iVar3 = Abc_Lit2Var(*puVar11);
        local_4c = Abc_Lit2Var(*puVar12);
        iVar4 = Abc_LitIsCompl(*puVar11);
        iVar5 = Abc_LitIsCompl(*puVar2);
        puVar11 = puVar2;
        if (iVar4 != iVar5) {
          puVar11 = local_48;
          local_48 = puVar2;
        }
      }
      else {
        iVar3 = Abc_LitIsCompl(puVar2[2]);
        iVar4 = Abc_LitIsCompl(puVar2[3]);
        if (iVar3 == iVar4) {
          return -1;
        }
        puVar12 = puVar2 + 2;
        puVar1 = puVar2 + 3;
        iVar3 = Abc_Lit2Var(*puVar2);
        local_4c = Abc_Lit2Var(puVar2[1]);
        iVar4 = Abc_LitIsCompl(*puVar2);
        iVar5 = Abc_LitIsCompl(puVar2[2]);
        if (iVar4 == iVar5) {
          iVar4 = Abc_LitIsCompl(*local_48);
          iVar5 = Abc_LitIsCompl(*puVar1);
          puVar11 = puVar12;
          local_48 = puVar1;
          if (iVar4 != iVar5) {
            __assertion = "Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[3])";
            uVar9 = 0x26;
            goto LAB_003f7845;
          }
        }
        else {
          iVar4 = Abc_LitIsCompl(*puVar2);
          iVar5 = Abc_LitIsCompl(puVar2[3]);
          if (iVar4 != iVar5) {
            __assertion = "Abc_LitIsCompl(L[0]) == Abc_LitIsCompl(L[3])";
            uVar9 = 0x2b;
            goto LAB_003f7845;
          }
          iVar4 = Abc_LitIsCompl(*local_48);
          iVar5 = Abc_LitIsCompl(*puVar12);
          puVar11 = puVar1;
          local_48 = puVar12;
          if (iVar4 != iVar5) {
            __assertion = "Abc_LitIsCompl(L[1]) == Abc_LitIsCompl(L[2])";
            uVar9 = 0x2c;
            goto LAB_003f7845;
          }
        }
      }
      iVar4 = Abc_Lit2Var(*puVar11);
      iVar5 = Abc_Lit2Var(*local_48);
      iVar6 = Abc_LitNot(local_4c);
      if (iVar3 == iVar6) {
        iVar8 = Abc_LitIsCompl(iVar3);
        iVar6 = iVar3;
        iVar7 = iVar5;
        if (iVar8 != 0) {
          iVar6 = local_4c;
          iVar7 = iVar4;
          iVar4 = iVar5;
          local_4c = iVar3;
        }
        iVar3 = Abc_LitIsCompl(iVar6);
        if (iVar3 == 0) {
          iVar3 = Abc_LitIsCompl(iVar4);
          if (iVar3 != 0) {
            iVar4 = Abc_LitNot(iVar4);
            iVar7 = Abc_LitNot(iVar7);
          }
          iVar3 = Abc_LitIsCompl(iVar4);
          if (iVar3 == 0) {
            uVar9 = Abc_Var2Lit(iVar6,0);
            *puVar2 = uVar9;
            uVar9 = Abc_Var2Lit(local_4c,1);
            puVar2[1] = uVar9;
            uVar9 = Abc_Var2Lit(iVar4,0);
            puVar2[2] = uVar9;
            uVar9 = Abc_Var2Lit(iVar7,1);
            puVar2[3] = uVar9;
            goto LAB_003f770f;
          }
          __assertion = "!Abc_LitIsCompl(LitA1)";
          uVar9 = 0x53;
        }
        else {
          __assertion = "!Abc_LitIsCompl(LitA0)";
          uVar9 = 0x4c;
        }
      }
      else {
        __assertion = "LitA0 == Abc_LitNot(LitB0)";
        uVar9 = 0x46;
      }
LAB_003f7845:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/FxchDiv.c"
                    ,uVar9,"int Fxch_DivNormalize(Vec_Int_t *)");
    }
    Vec_IntPush(pFxchMan->vCubeFree,iVar4);
    iVar6 = Abc_LitNot(iVar4);
    if (iVar3 == iVar6) {
      Vec_IntPush(pFxchMan->vCubeFree,iVar5);
      goto LAB_003f770f;
    }
    iVar4 = Abc_LitNot(iVar4);
    if (iVar5 != iVar4) goto LAB_003f770f;
    pVVar10 = pFxchMan->vCubeFree;
  }
  Vec_IntPush(pVVar10,iVar3);
LAB_003f770f:
  iVar4 = -1;
  iVar3 = pFxchMan->vCubeFree->nSize;
  if (iVar3 != 0) {
    if (iVar3 == 2) {
      qsort(pFxchMan->vCubeFree->pArray,2,4,Vec_IntSortCompare1);
      pVVar10 = pFxchMan->vCubeFree;
      iVar3 = Vec_IntEntry(pVVar10,0);
      iVar3 = Abc_Var2Lit(iVar3,0);
      Vec_IntWriteEntry(pVVar10,0,iVar3);
      pVVar10 = pFxchMan->vCubeFree;
      iVar3 = Vec_IntEntry(pVVar10,1);
      iVar3 = Abc_Var2Lit(iVar3,1);
      Vec_IntWriteEntry(pVVar10,1,iVar3);
    }
    pVVar10 = Fxch_ManGetCube(pFxchMan,pSubCube0->iCube);
    iVar3 = pVVar10->nSize;
    pVVar10 = Fxch_ManGetCube(pFxchMan,pSubCube1->iCube);
    uVar9 = pFxchMan->vCubeFree->nSize;
    if ((uVar9 & 1) == 0) {
      iVar4 = pVVar10->nSize;
      if (iVar3 < pVVar10->nSize) {
        iVar4 = iVar3;
      }
      iVar4 = ~((int)uVar9 >> 1) + iVar4;
    }
  }
  return iVar4;
}

Assistant:

int Fxch_DivCreate( Fxch_Man_t* pFxchMan,
                    Fxch_SubCube_t* pSubCube0,
                    Fxch_SubCube_t* pSubCube1 )
{
    int Base = 0;

    int SC0_Lit0,
        SC0_Lit1,
        SC1_Lit0,
        SC1_Lit1;

    int Cube0Size,
        Cube1Size;

    Vec_IntClear( pFxchMan->vCubeFree );

    SC0_Lit0 = Fxch_ManGetLit( pFxchMan, pSubCube0->iCube, pSubCube0->iLit0 );
    SC0_Lit1 = 0;
    SC1_Lit0 = Fxch_ManGetLit( pFxchMan, pSubCube1->iCube, pSubCube1->iLit0 );
    SC1_Lit1 = 0;

    if ( pSubCube0->iLit1 == 0 && pSubCube1->iLit1 == 0 )
    {
        Vec_IntPush( pFxchMan->vCubeFree, SC0_Lit0 );
        Vec_IntPush( pFxchMan->vCubeFree, SC1_Lit0 );
    }
    else if ( pSubCube0->iLit1 > 0 && pSubCube1->iLit1 > 0 )
    {
        int RetValue;

        SC0_Lit1 = Fxch_ManGetLit( pFxchMan, pSubCube0->iCube, pSubCube0->iLit1 );
        SC1_Lit1 = Fxch_ManGetLit( pFxchMan, pSubCube1->iCube, pSubCube1->iLit1 );

        if ( SC0_Lit0 < SC1_Lit0 )
        {
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC0_Lit0, 0 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC1_Lit0, 1 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC0_Lit1, 0 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC1_Lit1, 1 ) );
        }
        else
        {
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC1_Lit0, 0 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC0_Lit0, 1 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC1_Lit1, 0 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC0_Lit1, 1 ) );
        }

        RetValue = Fxch_DivNormalize( pFxchMan->vCubeFree );
        if ( RetValue == -1 )
            return -1;
    } 
    else
    {
        if ( pSubCube0->iLit1 > 0 )
        {
            SC0_Lit1 = Fxch_ManGetLit( pFxchMan, pSubCube0->iCube, pSubCube0->iLit1 );

            Vec_IntPush( pFxchMan->vCubeFree, SC1_Lit0 );
            if ( SC0_Lit0 == Abc_LitNot( SC1_Lit0 ) )
                Vec_IntPush( pFxchMan->vCubeFree, SC0_Lit1 );
            else if ( SC0_Lit1 == Abc_LitNot( SC1_Lit0 ) )
                Vec_IntPush( pFxchMan->vCubeFree, SC0_Lit0 );
        }
        else 
        {
            SC1_Lit1 = Fxch_ManGetLit( pFxchMan, pSubCube1->iCube, pSubCube1->iLit1 );

            Vec_IntPush( pFxchMan->vCubeFree, SC0_Lit0 );
            if ( SC1_Lit0 == Abc_LitNot( SC0_Lit0 ) )
                Vec_IntPush( pFxchMan->vCubeFree, SC1_Lit1 );
            else if ( SC1_Lit1 == Abc_LitNot( SC0_Lit0 ) )
                Vec_IntPush( pFxchMan->vCubeFree, SC1_Lit0 );
        }
    }

    if ( Vec_IntSize( pFxchMan->vCubeFree ) == 0 )
        return -1;

    if ( Vec_IntSize ( pFxchMan->vCubeFree ) == 2 )
    {
        Vec_IntSort( pFxchMan->vCubeFree, 0 );

        Vec_IntWriteEntry( pFxchMan->vCubeFree, 0, Abc_Var2Lit( Vec_IntEntry( pFxchMan->vCubeFree, 0 ), 0 ) );
        Vec_IntWriteEntry( pFxchMan->vCubeFree, 1, Abc_Var2Lit( Vec_IntEntry( pFxchMan->vCubeFree, 1 ), 1 ) );
    }

    Cube0Size = Vec_IntSize( Fxch_ManGetCube( pFxchMan, pSubCube0->iCube ) );
    Cube1Size = Vec_IntSize( Fxch_ManGetCube( pFxchMan, pSubCube1->iCube ) );
    if ( Vec_IntSize( pFxchMan->vCubeFree ) % 2 == 0 )
    {
        Base = Abc_MinInt( Cube0Size, Cube1Size )
               -( Vec_IntSize( pFxchMan->vCubeFree ) / 2)  - 1; /* 1 or 2 Lits, 1 SOP NodeID */
    }
    else
        return -1;

    return Base;
}